

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O0

void create_monitor_with_helpers_should_create_a_monitor(void)

{
  char *actual;
  char *monitor;
  
  actual = create_monitor_with_helpers();
  UnityAssertEqualString(json,actual,(char *)0x0,0xe6);
  free(actual);
  return;
}

Assistant:

static void create_monitor_with_helpers_should_create_a_monitor(void)
{
    char *monitor = create_monitor_with_helpers();

    TEST_ASSERT_EQUAL_STRING(json, monitor);

    free(monitor);
}